

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peglib.h
# Opt level: O0

shared_ptr<peg::Ope> __thiscall
peg::cho<peg::Definition&,peg::Definition&>(peg *this,Definition *args,Definition *args_1)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<peg::Ope> sVar1;
  undefined1 local_50 [32];
  shared_ptr<peg::Ope> local_30;
  undefined8 local_20;
  Definition *args_local_1;
  Definition *args_local;
  
  local_20 = args_1;
  args_local_1 = args;
  args_local = (Definition *)this;
  Definition::operator_cast_to_shared_ptr((Definition *)(local_50 + 0x10));
  Definition::operator_cast_to_shared_ptr((Definition *)local_50);
  std::make_shared<peg::PrioritizedChoice,std::shared_ptr<peg::Ope>,std::shared_ptr<peg::Ope>>
            (&local_30,(shared_ptr<peg::Ope> *)(local_50 + 0x10));
  std::shared_ptr<peg::Ope>::shared_ptr<peg::PrioritizedChoice,void>
            ((shared_ptr<peg::Ope> *)this,(shared_ptr<peg::PrioritizedChoice> *)&local_30);
  std::shared_ptr<peg::PrioritizedChoice>::~shared_ptr
            ((shared_ptr<peg::PrioritizedChoice> *)&local_30);
  std::shared_ptr<peg::Ope>::~shared_ptr((shared_ptr<peg::Ope> *)local_50);
  std::shared_ptr<peg::Ope>::~shared_ptr((shared_ptr<peg::Ope> *)(local_50 + 0x10));
  sVar1.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<peg::Ope>)sVar1.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Ope> cho(Args&& ...args) {
    return std::make_shared<PrioritizedChoice>(static_cast<std::shared_ptr<Ope>>(args)...);
}